

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

bool __thiscall
duckdb_snappy::SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>::SlowAppend
          (SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> *this,char *ip,size_t len)

{
  pointer *pppcVar1;
  iterator __position;
  char *pcVar2;
  ulong uVar3;
  ulong __n;
  ulong uVar4;
  bool bVar5;
  
  __n = (long)this->op_limit_ - (long)this->op_ptr_;
  bVar5 = len <= __n;
  if (!bVar5) {
    do {
      switchD_01602a8a::default(this->op_ptr_,ip,__n);
      pcVar2 = this->op_ptr_;
      this->op_ptr_ = pcVar2 + __n;
      pcVar2 = pcVar2 + __n + (this->full_size_ - (long)this->op_base_);
      this->full_size_ = (size_t)pcVar2;
      len = len - __n;
      if ((char *)this->expected_ < pcVar2 + len) {
        return bVar5;
      }
      uVar3 = (long)this->expected_ - (long)pcVar2;
      uVar4 = 0x10000;
      if (uVar3 < 0x10000) {
        uVar4 = uVar3;
      }
      pcVar2 = SnappySinkAllocator::Allocate(&this->allocator_,(int)uVar4);
      this->op_base_ = pcVar2;
      this->op_ptr_ = pcVar2;
      this->op_limit_ = pcVar2 + uVar4;
      if (0x3e < uVar3) {
        uVar3 = 0x3f;
      }
      this->op_limit_min_slop_ = pcVar2 + uVar4 + -uVar3;
      __position._M_current =
           (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                  ((vector<char*,std::allocator<char*>> *)&this->blocks_,__position,&this->op_base_)
        ;
      }
      else {
        *__position._M_current = pcVar2;
        pppcVar1 = &(this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
      ip = ip + __n;
      bVar5 = len <= uVar4;
      __n = uVar4;
    } while (uVar4 < len);
  }
  switchD_01602a8a::default(this->op_ptr_,ip,len);
  this->op_ptr_ = this->op_ptr_ + len;
  return bVar5;
}

Assistant:

bool SnappyScatteredWriter<Allocator>::SlowAppend(const char* ip, size_t len) {
  size_t avail = op_limit_ - op_ptr_;
  while (len > avail) {
    // Completely fill this block
    std::memcpy(op_ptr_, ip, avail);
    op_ptr_ += avail;
    assert(op_limit_ - op_ptr_ == 0);
    full_size_ += (op_ptr_ - op_base_);
    len -= avail;
    ip += avail;

    // Bounds check
    if (full_size_ + len > expected_) return false;

    // Make new block
    size_t bsize = std::min<size_t>(kBlockSize, expected_ - full_size_);
    op_base_ = allocator_.Allocate(bsize);
    op_ptr_ = op_base_;
    op_limit_ = op_base_ + bsize;
    op_limit_min_slop_ = op_limit_ - std::min<size_t>(kSlopBytes - 1, bsize);

    blocks_.push_back(op_base_);
    avail = bsize;
  }

  std::memcpy(op_ptr_, ip, len);
  op_ptr_ += len;
  return true;
}